

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall CLI::App::remove_excludes(App *this,App *app)

{
  _Rb_tree_const_iterator<CLI::App_*> __position;
  App *in_RSI;
  set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_> *in_RDI;
  App *other_app;
  _Rb_tree_const_iterator<CLI::App_*> iterator;
  set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_> *in_stack_ffffffffffffffb0;
  App **in_stack_ffffffffffffffb8;
  _Rb_tree_const_iterator<CLI::App_*> in_stack_ffffffffffffffc0;
  _Rb_tree_const_iterator<CLI::App_*> in_stack_ffffffffffffffc8;
  bool local_1;
  
  ::std::begin<std::set<CLI::App*,std::less<CLI::App*>,std::allocator<CLI::App*>>>(in_RDI);
  ::std::end<std::set<CLI::App*,std::less<CLI::App*>,std::allocator<CLI::App*>>>(in_RDI);
  __position = ::std::find<std::_Rb_tree_const_iterator<CLI::App*>,CLI::App*>
                         (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                          in_stack_ffffffffffffffb8);
  ::std::end<std::set<CLI::App*,std::less<CLI::App*>,std::allocator<CLI::App*>>>(in_RDI);
  local_1 = std::operator==((_Self *)&stack0xffffffffffffffe0,(_Self *)&stack0xffffffffffffffc8);
  if (!local_1) {
    std::_Rb_tree_const_iterator<CLI::App_*>::operator*
              ((_Rb_tree_const_iterator<CLI::App_*> *)in_stack_ffffffffffffffb0);
    ::std::set<CLI::App*,std::less<CLI::App*>,std::allocator<CLI::App*>>::erase_abi_cxx11_
              (in_stack_ffffffffffffffb0,(const_iterator)__position._M_node);
    remove_excludes(in_RSI,(App *)__position._M_node);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

CLI11_INLINE bool App::remove_excludes(App *app) {
    auto iterator = std::find(std::begin(exclude_subcommands_), std::end(exclude_subcommands_), app);
    if(iterator == std::end(exclude_subcommands_)) {
        return false;
    }
    auto *other_app = *iterator;
    exclude_subcommands_.erase(iterator);
    other_app->remove_excludes(this);
    return true;
}